

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lys_precompile_own_augments_mod(lysc_ctx *ctx,lysp_module *pmod)

{
  LY_ERR LVar1;
  lysp_node_augment *local_60;
  lysp_ext_instance *local_50;
  LY_ERR ret___1;
  LY_ERR ret__;
  lysp_node_augment *aug_p;
  uint64_t v;
  uint64_t u;
  lysp_module *pmod_local;
  lysc_ctx *ctx_local;
  
  for (_ret___1 = pmod->augments; _ret___1 != (lysp_node_augment *)0x0;
      _ret___1 = (_ret___1->field_0).field_1.next) {
    LVar1 = lys_precompile_own_augment(ctx,_ret___1,pmod,(lysp_ext_instance *)0x0);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
  }
  v = 0;
  do {
    if (pmod->exts == (lysp_ext_instance *)0x0) {
      local_50 = (lysp_ext_instance *)0x0;
    }
    else {
      local_50 = pmod->exts[-1].exts;
    }
    if (local_50 <= v) {
      return LY_SUCCESS;
    }
    _ret___1 = (lysp_node_augment *)0x0;
    aug_p = (lysp_node_augment *)0x0;
    while( true ) {
      if (pmod->exts[v].substmts == (lysp_ext_substmt *)0x0) {
        local_60 = (lysp_node_augment *)0x0;
      }
      else {
        local_60 = (lysp_node_augment *)pmod->exts[v].substmts[-1].storage_p;
      }
      if (local_60 <= aug_p) goto LAB_0017df2a;
      if (pmod->exts[v].substmts[(long)aug_p].stmt == LY_STMT_AUGMENT) break;
      aug_p = (lysp_node_augment *)((long)&aug_p->field_0 + 1);
    }
    _ret___1 = (lysp_node_augment *)*pmod->exts[v].substmts[(long)aug_p].storage_p;
LAB_0017df2a:
    if ((_ret___1 != (lysp_node_augment *)0x0) &&
       (LVar1 = lys_precompile_own_augment(ctx,_ret___1,pmod,pmod->exts + v), LVar1 != LY_SUCCESS))
    {
      return LVar1;
    }
    v = v + 1;
  } while( true );
}

Assistant:

static LY_ERR
lys_precompile_own_augments_mod(struct lysc_ctx *ctx, const struct lysp_module *pmod)
{
    LY_ARRAY_COUNT_TYPE u, v;
    struct lysp_node_augment *aug_p;

    /* module */
    LY_LIST_FOR(pmod->augments, aug_p) {
        LY_CHECK_RET(lys_precompile_own_augment(ctx, aug_p, pmod, NULL));
    }

    /* parsed extension instances */
    LY_ARRAY_FOR(pmod->exts, u) {
        aug_p = NULL;
        LY_ARRAY_FOR(pmod->exts[u].substmts, v) {
            if (pmod->exts[u].substmts[v].stmt == LY_STMT_AUGMENT) {
                aug_p = *(pmod->exts[u].substmts[v].storage_p);
                break;
            }
        }
        if (!aug_p) {
            continue;
        }

        LY_CHECK_RET(lys_precompile_own_augment(ctx, aug_p, pmod, &pmod->exts[u]));
    }

    return LY_SUCCESS;
}